

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clique.cc
# Opt level: O2

SearchResult __thiscall
anon_unknown.dwarf_299ed3::CliqueRunner::expand<true>
          (CliqueRunner *this,int depth,unsigned_long_long *nodes,unsigned_long_long *find_nodes,
          unsigned_long_long *prove_nodes,vector<int,_std::allocator<int>_> *c,SVOBitset *p,
          conditional_t<true,_const_SVOBitset_&,_int> a,int spacepos)

{
  pointer *ppiVar1;
  undefined4 uVar2;
  pointer piVar3;
  pointer piVar4;
  CliqueParams *pCVar5;
  pointer plVar6;
  Proof *pPVar7;
  vector<int,_std::allocator<int>_> *c_00;
  bool bVar8;
  int __tmp;
  uint uVar9;
  uint uVar10;
  int iVar11;
  SearchResult SVar12;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var13;
  byte bVar14;
  int v_2;
  ulong uVar15;
  _Self __tmp_1;
  const_iterator __position;
  undefined4 in_register_00000034;
  int *p_bounds;
  _List_node_base *p_Var16;
  _List_node_base *p_Var17;
  long lVar18;
  int *piVar19;
  int v_1;
  int iVar20;
  ulong uVar21;
  int v;
  vector<int,_std::allocator<int>_> *local_1b8;
  uint local_1ac;
  CliqueRunner *local_1a8;
  Incumbent *local_1a0;
  int *local_198;
  int *local_190;
  SearchResult local_184;
  undefined8 local_180;
  unsigned_long_long *local_178;
  unsigned_long_long *local_170;
  _List_node_base *local_168;
  unsigned_long_long *local_160;
  ulong local_158;
  long local_150;
  SVOBitset p_left;
  SVOBitset q;
  
  local_180 = CONCAT44(in_register_00000034,depth);
  *nodes = *nodes + 1;
  *prove_nodes = *prove_nodes + 1;
  piVar19 = this->space + spacepos;
  local_1ac = 0;
  p_bounds = this->space + (spacepos + this->size);
  local_1b8 = c;
  local_1a8 = this;
  local_198 = p_bounds;
  local_190 = piVar19;
  local_178 = find_nodes;
  local_170 = prove_nodes;
  local_160 = nodes;
  if ((c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start ==
      (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish)
  {
    colour_class_order(this,p,piVar19,p_bounds,(int *)&local_1ac);
    uVar10 = local_1ac;
  }
  else {
    gss::innards::SVOBitset::SVOBitset(&p_left,p);
    gss::innards::SVOBitset::intersect_with_complement(&p_left,a);
    iVar20 = 0;
    uVar10 = 0;
    while( true ) {
      bVar8 = gss::innards::SVOBitset::any(&p_left);
      if (!bVar8) break;
      gss::innards::SVOBitset::SVOBitset(&q,&p_left);
      iVar20 = iVar20 + 1;
      lVar18 = 0;
      while (bVar8 = gss::innards::SVOBitset::any(&q), bVar8) {
        uVar9 = gss::innards::SVOBitset::find_first(&q);
        gss::innards::SVOBitset::reset(&p_left,uVar9);
        gss::innards::SVOBitset::reset(&q,uVar9);
        gss::innards::SVOBitset::intersect_with_complement
                  (&q,(local_1a8->adj).
                      super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                      ._M_impl.super__Vector_impl_data._M_start + (int)uVar9);
        p_bounds[(int)uVar10 + lVar18] = iVar20;
        piVar19[(int)uVar10 + lVar18] = uVar9;
        lVar18 = lVar18 + 1;
      }
      uVar10 = uVar10 + (int)lVar18;
      gss::innards::SVOBitset::~SVOBitset(&q);
      c = local_1b8;
      p_bounds = local_198;
      piVar19 = local_190;
    }
    gss::innards::SVOBitset::operator=(&p_left,p);
    gss::innards::SVOBitset::operator&=(&p_left,a);
    while( true ) {
      bVar8 = gss::innards::SVOBitset::any(&p_left);
      if (!bVar8) break;
      gss::innards::SVOBitset::SVOBitset(&q,&p_left);
      iVar20 = iVar20 + 1;
      lVar18 = 0;
      while (bVar8 = gss::innards::SVOBitset::any(&q), bVar8) {
        uVar9 = gss::innards::SVOBitset::find_first(&q);
        gss::innards::SVOBitset::reset(&p_left,uVar9);
        gss::innards::SVOBitset::reset(&q,uVar9);
        gss::innards::SVOBitset::intersect_with_complement
                  (&q,(local_1a8->adj).
                      super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                      ._M_impl.super__Vector_impl_data._M_start + (int)uVar9);
        p_bounds[(int)uVar10 + lVar18] = iVar20;
        piVar19[(int)uVar10 + lVar18] = uVar9;
        lVar18 = lVar18 + 1;
      }
      uVar10 = uVar10 + (int)lVar18;
      gss::innards::SVOBitset::~SVOBitset(&q);
      c = local_1b8;
      p_bounds = local_198;
      piVar19 = local_190;
    }
    local_1ac = uVar10;
    gss::innards::SVOBitset::~SVOBitset(&p_left);
    this = local_1a8;
  }
  local_1a0 = &this->incumbent;
  iVar20 = (int)local_180 + 1;
  uVar21 = (ulong)uVar10;
  do {
    if ((int)uVar21 < 1) {
LAB_001560a0:
      (*((this->params->restarts_schedule)._M_t.
         super___uniq_ptr_impl<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_>.
         _M_t.
         super__Tuple_impl<0UL,_gss::RestartsSchedule_*,_std::default_delete<gss::RestartsSchedule>_>
         .super__Head_base<0UL,_gss::RestartsSchedule_*,_false>._M_head_impl)->
        _vptr_RestartsSchedule[2])();
      iVar20 = (*((this->params->restarts_schedule)._M_t.
                  super___uniq_ptr_impl<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_gss::RestartsSchedule_*,_std::default_delete<gss::RestartsSchedule>_>
                  .super__Head_base<0UL,_gss::RestartsSchedule_*,_false>._M_head_impl)->
                 _vptr_RestartsSchedule[4])();
      if ((char)iVar20 != '\0') {
        post_nogood(this,c);
        return Restart;
      }
      return Complete;
    }
    bVar8 = gss::Timeout::should_abort
                      ((this->params->timeout).
                       super___shared_ptr<gss::Timeout,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    if (bVar8) {
      return Aborted;
    }
    piVar3 = (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
    piVar4 = (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    uVar15 = uVar21 - 1;
    if ((ulong)((long)p_bounds[uVar15] + ((long)piVar3 - (long)piVar4 >> 2)) <=
        (ulong)local_1a0->value) {
      if ((this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          != (element_type *)0x0) {
        p_left._data.short_data[2] = 0;
        p_left._data.short_data[0] = 0;
        p_left._data.short_data[1] = 0;
        for (uVar15 = 0; uVar21 != uVar15; uVar15 = uVar15 + 1) {
          if ((uVar15 == 0) || (local_198[uVar15 - 1] != local_198[uVar15])) {
            std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::emplace_back<>((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              *)&p_left);
          }
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)(p_left._data.short_data[1] - 0x18),
                     (this->order).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start + piVar19[uVar15]);
        }
        gss::innards::Proof::colour_bound
                  ((this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr,(vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            *)&p_left);
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   *)&p_left);
      }
      goto LAB_001560a0;
    }
    v = piVar19[uVar15];
    local_158 = uVar15;
    if ((piVar4 != piVar3) && (bVar8 = gss::innards::SVOBitset::test(a,v), !bVar8)) {
      if ((this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          != (element_type *)0x0) {
        unpermute((vector<int,_std::allocator<int>_> *)&p_left,this,c);
        for (uVar15 = 0;
            pPVar7 = (this->proof).
                     super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
            uVar21 != uVar15; uVar15 = uVar15 + 1) {
          unpermute((vector<int,_std::allocator<int>_> *)&q,this,local_1b8);
          gss::innards::Proof::not_connected_in_underlying_graph
                    (pPVar7,(vector<int,_std::allocator<int>_> *)&q,
                     (this->order).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[piVar19[uVar15]]);
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    ((_Vector_base<int,_std::allocator<int>_> *)&q);
        }
        gss::innards::Proof::start_level(pPVar7,(int)local_180);
        c = local_1b8;
        pPVar7 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        unpermute((vector<int,_std::allocator<int>_> *)&q,this,local_1b8);
        gss::innards::Proof::backtrack_from_binary_variables
                  (pPVar7,(vector<int,_std::allocator<int>_> *)&q);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)&q);
        gss::innards::Proof::forget_level
                  ((this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr,iVar20);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)&p_left);
      }
      goto LAB_001560a0;
    }
    std::vector<int,_std::allocator<int>_>::push_back(c,&v);
    pCVar5 = this->params;
    if ((pCVar5->decide).super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_engaged == false) {
      bVar14 = (pCVar5->stop_after_finding).super__Optional_base<unsigned_int,_true,_true>.
               _M_payload.super__Optional_payload_base<unsigned_int>._M_engaged;
      if ((bool)bVar14 != false) goto LAB_00155b54;
      pPVar7 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      if (((pPVar7 != (Proof *)0x0) &&
          ((ulong)local_1a0->value <
           (ulong)((long)(c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start >> 2))) &&
         (pCVar5->proof_is_for_hom == false)) {
        gss::innards::Proof::start_level(pPVar7,0);
        pPVar7 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        unpermute_and_finish
                  ((vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *)&p_left,
                   this,c);
        gss::innards::Proof::new_incumbent
                  (pPVar7,(vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *)
                          &p_left);
        std::_Vector_base<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>::
        ~_Vector_base((_Vector_base<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *)
                      &p_left);
        gss::innards::Proof::start_level
                  ((this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr,iVar20);
      }
      Incumbent::update(local_1a0,c,local_178,local_170);
    }
    else {
      if ((pCVar5->decide).super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int>._M_payload._M_value <= local_1a0->value)
      goto LAB_00155f7a;
      bVar14 = (pCVar5->stop_after_finding).super__Optional_base<unsigned_int,_true,_true>.
               _M_payload.super__Optional_payload_base<unsigned_int>._M_engaged;
LAB_00155b54:
      if (((bVar14 & 1) != 0) &&
         ((pCVar5->stop_after_finding).super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int>._M_payload._M_value <= local_1a0->value)) {
LAB_00155f7a:
        pPVar7 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        if (pPVar7 != (Proof *)0x0) {
          unpermute((vector<int,_std::allocator<int>_> *)&p_left,this,c);
          gss::innards::Proof::post_solution(pPVar7,(vector<int,_std::allocator<int>_> *)&p_left);
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    ((_Vector_base<int,_std::allocator<int>_> *)&p_left);
        }
        return DecidedTrue;
      }
    }
    gss::innards::SVOBitset::SVOBitset(&p_left,p);
    gss::innards::SVOBitset::operator&=
              (&p_left,(this->adj).
                       super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                       ._M_impl.super__Vector_impl_data._M_start + v);
    iVar11 = (*((this->params->restarts_schedule)._M_t.
                super___uniq_ptr_impl<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_>
                ._M_t.
                super__Tuple_impl<0UL,_gss::RestartsSchedule_*,_std::default_delete<gss::RestartsSchedule>_>
                .super__Head_base<0UL,_gss::RestartsSchedule_*,_false>._M_head_impl)->
               _vptr_RestartsSchedule[5])();
    if ((char)iVar11 != '\0') {
      local_150 = (long)v;
      plVar6 = (local_1a8->watches).table.data.
               super__Vector_base<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<int>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<int>_>_>_>,_std::allocator<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<int>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<int>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_168 = (_List_node_base *)(plVar6 + local_150);
      __position._M_node =
           *(_List_node_base **)
            &plVar6[local_150].
             super__List_base<std::_List_iterator<gss::innards::Nogood<int>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<int>_>_>_>
             ._M_impl;
      p_Var17 = local_168;
LAB_00155c64:
      if (__position._M_node != p_Var17) {
        p_Var17 = __position._M_node[1]._M_next;
        p_Var16 = p_Var17[1]._M_next;
        iVar11 = *(int *)&p_Var16->_M_next;
        if (iVar11 != (int)local_150) {
          *(undefined4 *)&p_Var16->_M_next = *(undefined4 *)((long)&p_Var16->_M_next + 4);
          *(int *)((long)&p_Var16->_M_next + 4) = iVar11;
        }
        for (p_Var16 = (_List_node_base *)&p_Var16->_M_prev; p_Var16 != p_Var17[1]._M_prev;
            p_Var16 = (_List_node_base *)((long)&p_Var16->_M_next + 4)) {
          q._data.short_data[0]._0_4_ = *(undefined4 *)&p_Var16->_M_next;
          piVar19 = (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_finish;
          _Var13 = std::
                   __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                             ((c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_start,piVar19,&q);
          if (piVar19 == _Var13._M_current) {
            p_Var17 = p_Var17[1]._M_next;
            uVar2 = *(undefined4 *)&p_Var17->_M_next;
            *(undefined4 *)&p_Var17->_M_next = *(undefined4 *)&p_Var16->_M_next;
            *(undefined4 *)&p_Var16->_M_next = uVar2;
            std::__cxx11::
            list<std::_List_iterator<gss::innards::Nogood<int>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<int>_>_>_>
            ::push_back((local_1a8->watches).table.data.
                        super__Vector_base<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<int>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<int>_>_>_>,_std::allocator<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<int>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<int>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + *(int *)&p_Var17->_M_next,
                        (value_type *)(__position._M_node + 1));
            p_Var17 = local_168;
            p_Var16 = (__position._M_node)->_M_next;
            std::__cxx11::
            list<std::_List_iterator<gss::innards::Nogood<int>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<int>_>_>_>
            ::erase((list<std::_List_iterator<gss::innards::Nogood<int>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<int>_>_>_>
                     *)local_168,__position);
            c = local_1b8;
            __position._M_node = p_Var16;
            p_bounds = local_198;
            piVar19 = local_190;
            goto LAB_00155c64;
          }
        }
        gss::innards::SVOBitset::reset(&p_left,*(int *)((long)&(p_Var17[1]._M_next)->_M_next + 4));
        __position._M_node = (__position._M_node)->_M_next;
        p_bounds = local_198;
        p_Var17 = local_168;
        piVar19 = local_190;
        goto LAB_00155c64;
      }
    }
    this = local_1a8;
    pPVar7 = (local_1a8->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (pPVar7 != (Proof *)0x0) {
      gss::innards::Proof::start_level(pPVar7,iVar20);
    }
    bVar8 = gss::innards::SVOBitset::any(&p_left);
    SVar12 = local_184;
    if (bVar8) {
      gss::innards::SVOBitset::SVOBitset(&q,a);
      gss::innards::SVOBitset::operator|=
                (&q,(this->connected_table).
                    super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                    ._M_impl.super__Vector_impl_data._M_start + v);
      SVar12 = expand<true>(this,iVar20,local_160,local_178,local_170,c,&p_left,&q,
                            spacepos + this->size * 2);
      bVar8 = false;
      if (SVar12 != Aborted) {
        if (SVar12 == Restart) {
          ppiVar1 = &(local_1b8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppiVar1 = *ppiVar1 + -1;
          uVar10 = local_1ac;
          while (c_00 = local_1b8, (int)uVar21 < (int)uVar10) {
            uVar10 = uVar10 - 1;
            std::vector<int,_std::allocator<int>_>::push_back(local_1b8,piVar19 + uVar10);
            post_nogood(this,c_00);
            ppiVar1 = &(c_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_finish;
            *ppiVar1 = *ppiVar1 + -1;
            piVar19 = local_190;
          }
          bVar8 = false;
          SVar12 = Restart;
        }
        else {
          bVar8 = false;
          if (SVar12 != DecidedTrue) {
            bVar8 = true;
            SVar12 = local_184;
          }
        }
      }
      gss::innards::SVOBitset::~SVOBitset(&q);
      c = local_1b8;
      if (bVar8) goto LAB_00155e6d;
      bVar8 = false;
    }
    else {
LAB_00155e6d:
      pPVar7 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      if (pPVar7 != (Proof *)0x0) {
        gss::innards::Proof::start_level(pPVar7,(int)local_180);
        pPVar7 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        unpermute((vector<int,_std::allocator<int>_> *)&q,this,c);
        gss::innards::Proof::backtrack_from_binary_variables
                  (pPVar7,(vector<int,_std::allocator<int>_> *)&q);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)&q);
        gss::innards::Proof::forget_level
                  ((this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr,iVar20);
      }
      ppiVar1 = &(c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                 _M_finish;
      *ppiVar1 = *ppiVar1 + -1;
      gss::innards::SVOBitset::reset(p,v);
      bVar8 = true;
    }
    gss::innards::SVOBitset::~SVOBitset(&p_left);
    c = local_1b8;
    uVar21 = local_158;
    local_184 = SVar12;
    if (!bVar8) {
      return SVar12;
    }
  } while( true );
}

Assistant:

auto expand(
            int depth,
            unsigned long long & nodes,
            unsigned long long & find_nodes,
            unsigned long long & prove_nodes,
            vector<int> & c,
            SVOBitset & p,
            conditional_t<connected_, const SVOBitset &, int> a,
            int spacepos) -> SearchResult
        {
            ++nodes;
            ++prove_nodes;

            // initial colouring
            int * p_order = &space[spacepos];
            int * p_bounds = &space[spacepos + size];

            int p_end = 0;

            if constexpr (connected_) {
                if (! c.empty())
                    connected_colour_class_order(p, a, p_order, p_bounds, p_end);
                else
                    colour_class_order(p, p_order, p_bounds, p_end);
            }
            else {
                switch (params.colour_class_order) {
                case ColourClassOrder::ColourOrder: colour_class_order(p, p_order, p_bounds, p_end); break;
                case ColourClassOrder::SingletonsFirst: colour_class_order_2df(p, p_order, p_bounds, &space[spacepos + 2 * size], p_end); break;
                case ColourClassOrder::Sorted: colour_class_order_sorted(p, p_order, p_bounds, p_end); break;
                }
            }

            // for each v in p... (v comes later)
            for (int n = p_end - 1; n >= 0; --n) {
                // bound, timeout or early exit?
                if (params.timeout->should_abort())
                    return SearchResult::Aborted;

                if (c.size() + p_bounds[n] <= incumbent.value) {
                    if (proof) {
                        vector<vector<int>> colour_classes;
                        for (int v = 0; v <= n; ++v) {
                            if (0 == v || p_bounds[v - 1] != p_bounds[v])
                                colour_classes.emplace_back();
                            colour_classes.back().push_back(order[p_order[v]]);
                        }
                        proof->colour_bound(colour_classes);
                    }
                    break;
                }

                // if we've used k colours to colour k vertices, it's a clique. this isn't (I think?) a
                // valid shortcut in the connected case.
                if constexpr (! connected_) {
                    if (p_bounds[n] == n + 1) {
                        auto c_save = c;
                        for (; n >= 0; --n)
                            c.push_back(p_order[n]);
                        incumbent.update(c, find_nodes, prove_nodes);

                        if (proof && ! params.decide) {
                            proof->start_level(0);
                            proof->new_incumbent(unpermute_and_finish(c));
                            proof->start_level(depth + 1);
                        }

                        if ((params.decide && incumbent.value >= *params.decide) ||
                            (params.stop_after_finding && incumbent.value >= *params.stop_after_finding)) {
                            if (proof)
                                proof->post_solution(unpermute(c));

                            return SearchResult::DecidedTrue;
                        }

                        c = move(c_save);

                        break;
                    }
                }

                auto v = p_order[n];

                if constexpr (connected_) {
                    if ((! c.empty()) && (! a.test(v))) {
                        // none of the remaining vertices can give a connected underlying graph
                        if (proof) {
                            auto c_unpermuted = unpermute(c);
                            for (int v = 0; v <= n; ++v)
                                proof->not_connected_in_underlying_graph(unpermute(c), order[p_order[v]]);

                            proof->start_level(depth);
                            proof->backtrack_from_binary_variables(unpermute(c));
                            proof->forget_level(depth + 1);
                        }

                        break;
                    }
                }

                // consider taking v
                c.push_back(v);

                if (params.decide || params.stop_after_finding) {
                    if ((params.decide && incumbent.value >= *params.decide) ||
                        (params.stop_after_finding && incumbent.value >= *params.stop_after_finding)) {
                        if (proof)
                            proof->post_solution(unpermute(c));

                        return SearchResult::DecidedTrue;
                    }
                }
                else {
                    if (proof && c.size() > incumbent.value && ! params.proof_is_for_hom) {
                        proof->start_level(0);
                        proof->new_incumbent(unpermute_and_finish(c));
                        proof->start_level(depth + 1);
                    }
                    incumbent.update(c, find_nodes, prove_nodes);
                }

                // filter p to contain vertices adjacent to v
                SVOBitset new_p = p;
                new_p &= adj[v];

                if (params.restarts_schedule->might_restart())
                    watches.propagate(
                        v,
                        [&](int literal) { return c.end() == find(c.begin(), c.end(), literal); },
                        [&](int literal) { new_p.reset(literal); });

                if (proof)
                    proof->start_level(depth + 1);

                if (new_p.any()) {
                    auto new_a = a;

                    if constexpr (connected_) {
                        new_a |= connected_table[v];
                    }

                    switch (expand<connected_>(depth + 1, nodes, find_nodes, prove_nodes, c, new_p, new_a, spacepos + 2 * size)) {
                    case SearchResult::Aborted:
                        return SearchResult::Aborted;

                    case SearchResult::DecidedTrue:
                        return SearchResult::DecidedTrue;

                    case SearchResult::Complete:
                        break;

                    case SearchResult::Restart:
                        // restore assignments before posting nogoods, it's easier
                        c.pop_back();

                        // post nogoods for everything we've done so far
                        for (int m = p_end - 1; m > n; --m) {
                            c.push_back(p_order[m]);
                            post_nogood(c);
                            c.pop_back();
                        }

                        return SearchResult::Restart;
                    }
                }

                if (proof) {
                    proof->start_level(depth);
                    proof->backtrack_from_binary_variables(unpermute(c));
                    proof->forget_level(depth + 1);
                }

                // now consider not taking v
                c.pop_back();
                p.reset(v);
            }

            params.restarts_schedule->did_a_backtrack();
            if (params.restarts_schedule->should_restart()) {
                post_nogood(c);
                return SearchResult::Restart;
            }
            else
                return SearchResult::Complete;
        }